

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *pat,Replaceable *text,int32_t index,int32_t limit)

{
  short sVar1;
  UBool UVar2;
  bool bVar3;
  uint uVar4;
  uint c;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint unaff_R15D;
  
  sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (pat->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if (iVar7 != 0) {
    iVar7 = 0;
    uVar4 = UnicodeString::char32At(pat,0);
    if (index < limit) {
      do {
        c = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)(uint)index);
        if (uVar4 == 0x7e) {
          UVar2 = PatternProps::isWhiteSpace(c);
          if (UVar2 == '\0') {
            sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar5 = (pat->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar1 >> 5;
            }
            iVar7 = iVar7 + 1;
            if (iVar7 == iVar5) {
              uVar4 = 0x7e;
              bVar3 = true;
              uVar6 = index;
              goto LAB_00190e14;
            }
LAB_00190dff:
            uVar4 = UnicodeString::char32At(pat,iVar7);
          }
          else {
            index = (index - (uint)(c < 0x10000)) + 2;
            uVar4 = 0x7e;
          }
          bVar3 = false;
          uVar6 = unaff_R15D;
        }
        else {
          bVar3 = true;
          uVar6 = 0xffffffff;
          if (c == uVar4) {
            sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar5 = (pat->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar1 >> 5;
            }
            index = (index - (uint)(c < 0x10000)) + 2;
            iVar7 = (iVar7 - (uint)(uVar4 < 0x10000)) + 2;
            uVar6 = index;
            if (iVar7 != iVar5) goto LAB_00190dff;
          }
        }
LAB_00190e14:
        if (bVar3) {
          return uVar6;
        }
        unaff_R15D = uVar6;
      } while (index < limit);
    }
    index = -1;
  }
  return index;
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& pat,
                                  const Replaceable& text,
                                  int32_t index,
                                  int32_t limit) {
    int32_t ipat = 0;

    // empty pattern matches immediately
    if (ipat == pat.length()) {
        return index;
    }

    UChar32 cpat = pat.char32At(ipat);

    while (index < limit) {
        UChar32 c = text.char32At(index);

        // parse \s*
        if (cpat == 126 /*~*/) {
            if (PatternProps::isWhiteSpace(c)) {
                index += U16_LENGTH(c);
                continue;
            } else {
                if (++ipat == pat.length()) {
                    return index; // success; c unparsed
                }
                // fall thru; process c again with next cpat
            }
        }

        // parse literal
        else if (c == cpat) {
            index += U16_LENGTH(c);
            ipat += U16_LENGTH(cpat);
            if (ipat == pat.length()) {
                return index; // success; c parsed
            }
            // fall thru; get next cpat
        }

        // match failure of literal
        else {
            return -1;
        }

        cpat = pat.char32At(ipat);
    }

    return -1; // text ended before end of pat
}